

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts3DeleteByRowid(Fts3Table *p,sqlite3_value *pRowid,int *pnChng,u32 *aSzDel)

{
  char *pcVar1;
  int iVar2;
  int iLangid;
  int iVar3;
  Mem *pMVar4;
  i64 iVar5;
  uchar *zText;
  sqlite3_stmt *psVar6;
  u32 *pnWord;
  long lVar7;
  int local_6c;
  sqlite3_stmt *local_68;
  int *local_60;
  u32 *local_58;
  int local_4c;
  sqlite3_value *local_48;
  sqlite3_stmt *local_40;
  sqlite3_value *local_38;
  
  local_48 = pRowid;
  local_38 = pRowid;
  iVar2 = fts3SqlStmt(p,7,&local_40,&local_38);
  psVar6 = local_40;
  if (iVar2 == 0) {
    local_68 = local_40;
    local_60 = pnChng;
    local_4c = sqlite3_step(local_40);
    psVar6 = local_68;
    local_58 = aSzDel;
    if (local_4c != 100) {
LAB_00181095:
      iVar2 = local_4c;
      local_6c = sqlite3_reset(psVar6);
      if (iVar2 != 100 || local_6c != 0) {
        return local_6c;
      }
      if (p->zContentTbl == (char *)0x0) {
        local_38 = pRowid;
        iVar2 = fts3SqlStmt(p,1,&local_40,&local_38);
        if (iVar2 != 0) {
          return iVar2;
        }
        iVar2 = sqlite3_step(local_40);
        if (iVar2 == 100) {
          pMVar4 = columnMem(local_40,0);
          iVar5 = sqlite3VdbeIntValue(pMVar4);
          columnMallocFailure(local_40);
          local_6c = sqlite3_reset(local_40);
          if (local_6c != 0) {
            return local_6c;
          }
          iVar2 = 0;
          if ((int)iVar5 != 0) {
            local_6c = fts3DeleteAll(p,1);
            *local_60 = 0;
            memset(local_58,0,(long)p->nColumn * 8 + 8);
            return local_6c;
          }
        }
        else {
          iVar2 = sqlite3_reset(local_40);
          if (iVar2 != 0) {
            return iVar2;
          }
        }
        local_6c = iVar2;
        pcVar1 = p->zContentTbl;
        *local_60 = *local_60 + -1;
        if (pcVar1 == (char *)0x0) {
          fts3SqlExec(&local_6c,p,0,&local_48);
        }
      }
      else {
        local_6c = 0;
        *local_60 = *local_60 + -1;
        local_38 = pRowid;
      }
      if (p->bHasDocsize == '\0') {
        return local_6c;
      }
      fts3SqlExec(&local_6c,p,0x13,&local_48);
      return local_6c;
    }
    iLangid = langidFromSelect(p,local_68);
    pMVar4 = columnMem(psVar6,0);
    iVar5 = sqlite3VdbeIntValue(pMVar4);
    columnMallocFailure(psVar6);
    iVar2 = fts3PendingTermsDocid(p,iLangid,iVar5);
    psVar6 = local_68;
    if (iVar2 == 0) {
      lVar7 = 1;
      pnWord = local_58;
      do {
        if (p->nColumn < lVar7) goto LAB_00181095;
        iVar2 = 0;
        if (p->abNotindexed[lVar7 + -1] == '\0') {
          zText = sqlite3_column_text(psVar6,(int)lVar7);
          iVar2 = fts3PendingTermsAdd(p,iLangid,(char *)zText,-1,pnWord);
          iVar3 = sqlite3_column_bytes(local_68,(int)lVar7);
          local_58[p->nColumn] = local_58[p->nColumn] + iVar3;
          psVar6 = local_68;
        }
        lVar7 = lVar7 + 1;
        pnWord = pnWord + 1;
      } while (iVar2 == 0);
    }
  }
  sqlite3_reset(psVar6);
  return iVar2;
}

Assistant:

static int fts3DeleteByRowid(
  Fts3Table *p, 
  sqlite3_value *pRowid, 
  int *pnChng,                    /* IN/OUT: Decrement if row is deleted */
  u32 *aSzDel
){
  int rc = SQLITE_OK;             /* Return code */
  int bFound = 0;                 /* True if *pRowid really is in the table */

  fts3DeleteTerms(&rc, p, pRowid, aSzDel, &bFound);
  if( bFound && rc==SQLITE_OK ){
    int isEmpty = 0;              /* Deleting *pRowid leaves the table empty */
    rc = fts3IsEmpty(p, pRowid, &isEmpty);
    if( rc==SQLITE_OK ){
      if( isEmpty ){
        /* Deleting this row means the whole table is empty. In this case
        ** delete the contents of all three tables and throw away any
        ** data in the pendingTerms hash table.  */
        rc = fts3DeleteAll(p, 1);
        *pnChng = 0;
        memset(aSzDel, 0, sizeof(u32) * (p->nColumn+1) * 2);
      }else{
        *pnChng = *pnChng - 1;
        if( p->zContentTbl==0 ){
          fts3SqlExec(&rc, p, SQL_DELETE_CONTENT, &pRowid);
        }
        if( p->bHasDocsize ){
          fts3SqlExec(&rc, p, SQL_DELETE_DOCSIZE, &pRowid);
        }
      }
    }
  }

  return rc;
}